

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qconcatenatetablesproxymodel.cpp
# Opt level: O0

ItemFlags __thiscall
QConcatenateTablesProxyModel::flags(QConcatenateTablesProxyModel *this,QModelIndex *index)

{
  long lVar1;
  bool bVar2;
  const_reference pMVar3;
  QAbstractItemModel *pQVar4;
  undefined8 in_RSI;
  long in_FS_OFFSET;
  QConcatenateTablesProxyModelPrivate *d;
  QModelIndex sourceIndex;
  undefined4 in_stack_ffffffffffffffa8;
  ItemFlag in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QConcatenateTablesProxyModel *)0x85779f);
  bVar2 = QList<QConcatenateTablesProxyModelPrivate::ModelInfo>::isEmpty
                    ((QList<QConcatenateTablesProxyModelPrivate::ModelInfo> *)0x8577b5);
  if (bVar2) {
    QFlags<Qt::ItemFlag>::QFlags
              ((QFlags<Qt::ItemFlag> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
               ,in_stack_ffffffffffffffac);
  }
  else {
    bVar2 = QModelIndex::isValid
                      ((QModelIndex *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0))
    ;
    if (bVar2) {
      mapToSource((QConcatenateTablesProxyModel *)&DAT_aaaaaaaaaaaaaaaa,
                  (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa);
      pQVar4 = QModelIndex::model((QModelIndex *)0x857848);
      local_c.super_QFlagsStorage<Qt::ItemFlag>.i =
           (QFlagsStorage<Qt::ItemFlag>)
           (*(pQVar4->super_QObject)._vptr_QObject[0x27])(pQVar4,&stack0xffffffffffffffd8);
    }
    else {
      pMVar3 = QList<QConcatenateTablesProxyModelPrivate::ModelInfo>::at
                         ((QList<QConcatenateTablesProxyModelPrivate::ModelInfo> *)
                          CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      local_c.super_QFlagsStorage<Qt::ItemFlag>.i =
           (QFlagsStorage<Qt::ItemFlag>)
           (*(pMVar3->model->super_QObject)._vptr_QObject[0x27])(pMVar3->model,in_RSI);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QFlagsStorageHelper<Qt::ItemFlag,_4>)
           (QFlagsStorageHelper<Qt::ItemFlag,_4>)local_c.super_QFlagsStorage<Qt::ItemFlag>.i;
  }
  __stack_chk_fail();
}

Assistant:

Qt::ItemFlags QConcatenateTablesProxyModel::flags(const QModelIndex &index) const
{
    Q_D(const QConcatenateTablesProxyModel);
    if (d->m_models.isEmpty())
        return Qt::NoItemFlags;
    Q_ASSERT(checkIndex(index));
    if (!index.isValid())
        return d->m_models.at(0).model->flags(index);
    const QModelIndex sourceIndex = mapToSource(index);
    Q_ASSERT(sourceIndex.isValid());
    return sourceIndex.model()->flags(sourceIndex);
}